

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  ImGuiListClipperData *this_00;
  ImGuiListClipperData *data;
  ImGuiListClipperData local_58;
  ImGuiTable *local_30;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  float items_height_local;
  int items_count_local;
  ImGuiListClipper *this_local;
  
  window = (ImGuiWindow *)GImGui;
  table = (ImGuiTable *)GImGui->CurrentWindow;
  local_30 = GImGui->CurrentTable;
  g._0_4_ = items_height;
  g._4_4_ = items_count;
  _items_height_local = this;
  if ((local_30 != (ImGuiTable *)0x0) && ((local_30->IsInsideRow & 1U) != 0)) {
    ImGui::TableEndRow(local_30);
  }
  this->StartPosY = (table->InnerClipRect).Min.x;
  this->ItemsHeight = g._0_4_;
  this->ItemsCount = g._4_4_;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  fVar2 = (float)((int)window[0x10].ScrollMax.x + 1);
  window[0x10].ScrollMax.x = fVar2;
  if ((int)window[0x10].ScrollTarget.x < (int)fVar2) {
    pIVar1 = window + 0x10;
    fVar2 = window[0x10].ScrollMax.x;
    ImGuiListClipperData::ImGuiListClipperData(&local_58);
    ImVector<ImGuiListClipperData>::resize
              ((ImVector<ImGuiListClipperData> *)&pIVar1->ScrollTarget,(int)fVar2,&local_58);
    ImGuiListClipperData::~ImGuiListClipperData(&local_58);
  }
  this_00 = ImVector<ImGuiListClipperData>::operator[]
                      ((ImVector<ImGuiListClipperData> *)&window[0x10].ScrollTarget,
                       (int)window[0x10].ScrollMax.x + -1);
  ImGuiListClipperData::Reset(this_00,this);
  this_00->LossynessOffset = (table->HostClipRect).Max.y;
  this->TempData = this_00;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}